

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

int SUNMatScaleAdd_Sparse(realtype c,SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  void *__ptr;
  void *__ptr_00;
  SUNMatrix A_00;
  SUNMatrix C;
  realtype *Cx;
  realtype *Bx;
  realtype *Ax;
  realtype *x;
  sunindextype *Ci;
  sunindextype *Cp;
  sunindextype *Bi;
  sunindextype *Bp;
  sunindextype *Ai;
  sunindextype *Ap;
  sunindextype *w;
  long lStack_68;
  int newmat;
  sunindextype cend;
  sunindextype N;
  sunindextype M;
  sunindextype newvals;
  sunindextype nz;
  sunindextype p;
  sunindextype i;
  sunindextype j;
  SUNMatrix B_local;
  SUNMatrix A_local;
  realtype c_local;
  
  iVar11 = SMCompatible_Sparse(A,B);
  if (iVar11 == 0) {
    c_local._4_4_ = 1;
  }
  else {
    if (*(int *)((long)A->content + 0x28) == 0) {
      N = *A->content;
      cend = *(sunindextype *)((long)A->content + 8);
    }
    else {
      N = *(sunindextype *)((long)A->content + 8);
      cend = *A->content;
    }
    if (*(long *)((long)A->content + 0x38) == 0) {
      c_local._4_4_ = -1;
    }
    else {
      lVar1 = *(long *)((long)A->content + 0x38);
      if (*(long *)((long)A->content + 0x30) == 0) {
        c_local._4_4_ = -1;
      }
      else {
        lVar2 = *(long *)((long)A->content + 0x30);
        if (*(long *)((long)A->content + 0x20) == 0) {
          c_local._4_4_ = -1;
        }
        else {
          lVar3 = *(long *)((long)A->content + 0x20);
          if (*(long *)((long)B->content + 0x38) == 0) {
            c_local._4_4_ = -1;
          }
          else {
            lVar4 = *(long *)((long)B->content + 0x38);
            if (*(long *)((long)B->content + 0x30) == 0) {
              c_local._4_4_ = -1;
            }
            else {
              lVar5 = *(long *)((long)B->content + 0x30);
              if (*(long *)((long)B->content + 0x20) == 0) {
                c_local._4_4_ = -1;
              }
              else {
                lVar6 = *(long *)((long)B->content + 0x20);
                __ptr = malloc(N << 3);
                __ptr_00 = malloc(N << 3);
                M = 0;
                for (i = 0; i < cend; i = i + 1) {
                  for (p = 0; p < N; p = p + 1) {
                    *(undefined8 *)((long)__ptr + p * 8) = 0;
                  }
                  for (p = *(sunindextype *)(lVar1 + i * 8); p < *(long *)(lVar1 + 8 + i * 8);
                      p = p + 1) {
                    lVar7 = *(long *)(lVar2 + p * 8);
                    *(long *)((long)__ptr + lVar7 * 8) = *(long *)((long)__ptr + lVar7 * 8) + 1;
                  }
                  for (p = *(sunindextype *)(lVar4 + i * 8); p < *(long *)(lVar4 + 8 + i * 8);
                      p = p + 1) {
                    lVar7 = *(long *)(lVar5 + p * 8);
                    *(long *)((long)__ptr + lVar7 * 8) = *(long *)((long)__ptr + lVar7 * 8) + -1;
                  }
                  for (p = 0; p < N; p = p + 1) {
                    if (*(long *)((long)__ptr + p * 8) < 0) {
                      M = M + 1;
                    }
                  }
                }
                if (M == 0) {
                  for (i = 0; i < cend; i = i + 1) {
                    for (p = 0; p < N; p = p + 1) {
                      *(undefined8 *)((long)__ptr_00 + p * 8) = 0;
                    }
                    for (p = *(sunindextype *)(lVar4 + i * 8); p < *(long *)(lVar4 + 8 + i * 8);
                        p = p + 1) {
                      *(undefined8 *)((long)__ptr_00 + *(long *)(lVar5 + p * 8) * 8) =
                           *(undefined8 *)(lVar6 + p * 8);
                    }
                    for (p = *(sunindextype *)(lVar1 + i * 8); p < *(long *)(lVar1 + 8 + i * 8);
                        p = p + 1) {
                      *(double *)(lVar3 + p * 8) =
                           c * *(double *)(lVar3 + p * 8) +
                           *(double *)((long)__ptr_00 + *(long *)(lVar2 + p * 8) * 8);
                    }
                  }
                }
                else if (*(long *)((long)A->content + 0x10) - *(long *)(lVar1 + cend * 8) < M) {
                  A_00 = SUNSparseMatrix(*A->content,*(sunindextype *)((long)A->content + 8),
                                         *(long *)(lVar1 + cend * 8) + M,
                                         *(int *)((long)A->content + 0x28));
                  if (*(long *)((long)A_00->content + 0x38) == 0) {
                    return -1;
                  }
                  lVar7 = *(long *)((long)A_00->content + 0x38);
                  if (*(long *)((long)A_00->content + 0x30) == 0) {
                    return -1;
                  }
                  lVar8 = *(long *)((long)A_00->content + 0x30);
                  if (*(long *)((long)A_00->content + 0x20) == 0) {
                    return -1;
                  }
                  lVar9 = *(long *)((long)A_00->content + 0x20);
                  newvals = 0;
                  for (i = 0; i < cend; i = i + 1) {
                    *(sunindextype *)(lVar7 + i * 8) = newvals;
                    for (p = 0; p < N; p = p + 1) {
                      *(undefined8 *)((long)__ptr + p * 8) = 0;
                      *(undefined8 *)((long)__ptr_00 + p * 8) = 0;
                    }
                    for (nz = *(sunindextype *)(lVar1 + i * 8); nz < *(long *)(lVar1 + 8 + i * 8);
                        nz = nz + 1) {
                      lVar10 = *(long *)(lVar2 + nz * 8);
                      *(long *)((long)__ptr + lVar10 * 8) = *(long *)((long)__ptr + lVar10 * 8) + 1;
                      *(double *)((long)__ptr_00 + *(long *)(lVar2 + nz * 8) * 8) =
                           c * *(double *)(lVar3 + nz * 8);
                    }
                    for (nz = *(sunindextype *)(lVar4 + i * 8); nz < *(long *)(lVar4 + 8 + i * 8);
                        nz = nz + 1) {
                      lVar10 = *(long *)(lVar5 + nz * 8);
                      *(long *)((long)__ptr + lVar10 * 8) = *(long *)((long)__ptr + lVar10 * 8) + 1;
                      lVar10 = *(long *)(lVar5 + nz * 8);
                      *(double *)((long)__ptr_00 + lVar10 * 8) =
                           *(double *)(lVar6 + nz * 8) + *(double *)((long)__ptr_00 + lVar10 * 8);
                    }
                    for (p = 0; p < N; p = p + 1) {
                      if (0 < *(long *)((long)__ptr + p * 8)) {
                        *(sunindextype *)(lVar8 + newvals * 8) = p;
                        *(undefined8 *)(lVar9 + newvals * 8) =
                             *(undefined8 *)((long)__ptr_00 + p * 8);
                        newvals = newvals + 1;
                      }
                    }
                  }
                  *(sunindextype *)(lVar7 + cend * 8) = newvals;
                  *(undefined8 *)((long)A->content + 0x10) =
                       *(undefined8 *)((long)A_00->content + 0x10);
                  free(*(void **)((long)A->content + 0x20));
                  *(undefined8 *)((long)A->content + 0x20) =
                       *(undefined8 *)((long)A_00->content + 0x20);
                  *(undefined8 *)((long)A_00->content + 0x20) = 0;
                  free(*(void **)((long)A->content + 0x30));
                  *(undefined8 *)((long)A->content + 0x30) =
                       *(undefined8 *)((long)A_00->content + 0x30);
                  *(undefined8 *)((long)A_00->content + 0x30) = 0;
                  free(*(void **)((long)A->content + 0x38));
                  *(undefined8 *)((long)A->content + 0x38) =
                       *(undefined8 *)((long)A_00->content + 0x38);
                  *(undefined8 *)((long)A_00->content + 0x38) = 0;
                  SUNMatDestroy_Sparse(A_00);
                }
                else {
                  newvals = *(long *)(lVar1 + cend * 8) + M;
                  lStack_68 = *(long *)(lVar1 + cend * 8);
                  *(sunindextype *)(lVar1 + cend * 8) = newvals;
                  while (i = cend + -1, -1 < i) {
                    for (p = 0; p < N; p = p + 1) {
                      *(undefined8 *)((long)__ptr + p * 8) = 0;
                      *(undefined8 *)((long)__ptr_00 + p * 8) = 0;
                    }
                    for (nz = *(sunindextype *)(lVar1 + i * 8); nz < lStack_68; nz = nz + 1) {
                      lVar7 = *(long *)(lVar2 + nz * 8);
                      *(long *)((long)__ptr + lVar7 * 8) = *(long *)((long)__ptr + lVar7 * 8) + 1;
                      *(double *)((long)__ptr_00 + *(long *)(lVar2 + nz * 8) * 8) =
                           c * *(double *)(lVar3 + nz * 8);
                    }
                    for (nz = *(sunindextype *)(lVar4 + i * 8); p = N,
                        nz < *(long *)(lVar4 + 8 + i * 8); nz = nz + 1) {
                      lVar7 = *(long *)(lVar5 + nz * 8);
                      *(long *)((long)__ptr + lVar7 * 8) = *(long *)((long)__ptr + lVar7 * 8) + 1;
                      lVar7 = *(long *)(lVar5 + nz * 8);
                      *(double *)((long)__ptr_00 + lVar7 * 8) =
                           *(double *)(lVar6 + nz * 8) + *(double *)((long)__ptr_00 + lVar7 * 8);
                    }
                    while (p = p + -1, -1 < p) {
                      if (0 < *(long *)((long)__ptr + p * 8)) {
                        *(sunindextype *)(lVar2 + -8 + newvals * 8) = p;
                        *(undefined8 *)(lVar3 + (newvals + -1) * 8) =
                             *(undefined8 *)((long)__ptr_00 + p * 8);
                        newvals = newvals + -1;
                      }
                    }
                    lStack_68 = *(long *)(lVar1 + i * 8);
                    *(sunindextype *)(lVar1 + i * 8) = newvals;
                    cend = i;
                  }
                }
                free(__ptr);
                free(__ptr_00);
                c_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return c_local._4_4_;
}

Assistant:

int SUNMatScaleAdd_Sparse(realtype c, SUNMatrix A, SUNMatrix B)
{
  sunindextype j, i, p, nz, newvals, M, N, cend;
  booleantype newmat;
  sunindextype *w, *Ap, *Ai, *Bp, *Bi, *Cp, *Ci;
  realtype *x, *Ax, *Bx, *Cx;
  SUNMatrix C;

  /* Verify that A and B are compatible */
  if (!SMCompatible_Sparse(A, B))
    return 1;

  /* store shortcuts to matrix dimensions (M is inner dimension, N is outer) */
  if (SM_SPARSETYPE_S(A) == CSC_MAT) {
    M = SM_ROWS_S(A);
    N = SM_COLUMNS_S(A);
  }
  else {
    M = SM_COLUMNS_S(A);
    N = SM_ROWS_S(A);
  }

  /* access data arrays from A and B (return if failure) */
  Ap = Ai = Bp = Bi = NULL;
  Ax = Bx = NULL;
  if (SM_INDEXPTRS_S(A))  Ap = SM_INDEXPTRS_S(A);
  else  return(-1);
  if (SM_INDEXVALS_S(A))  Ai = SM_INDEXVALS_S(A);
  else  return(-1);
  if (SM_DATA_S(A))       Ax = SM_DATA_S(A);
  else  return(-1);
  if (SM_INDEXPTRS_S(B))  Bp = SM_INDEXPTRS_S(B);
  else  return(-1);
  if (SM_INDEXVALS_S(B))  Bi = SM_INDEXVALS_S(B);
  else  return(-1);
  if (SM_DATA_S(B))       Bx = SM_DATA_S(B);
  else  return(-1);

  /* create work arrays for row indices and nonzero column values */
  w = (sunindextype *) malloc(M * sizeof(sunindextype));
  x = (realtype *) malloc(M * sizeof(realtype));

  /* determine if A already contains the sparsity pattern of B */
  newvals = 0;
  for (j=0; j<N; j++) {

    /* clear work array */
    for (i=0; i<M; i++)  w[i] = 0;

    /* scan column of A, incrementing w by one */
    for (i=Ap[j]; i<Ap[j+1]; i++)
      w[Ai[i]] += 1;

    /* scan column of B, decrementing w by one */
    for (i=Bp[j]; i<Bp[j+1]; i++)
      w[Bi[i]] -= 1;

    /* if any entry of w is negative, A doesn't contain B's sparsity, 
       so increment necessary storage counter */
    for (i=0; i<M; i++)
      if (w[i] < 0)  newvals += 1;
  }

  /* If extra nonzeros required, check whether A has sufficient storage space 
     for new nonzero entries (so B can be inserted into existing storage) */
  newmat = SUNFALSE;   /* no reallocation needed */
  if (newvals > (SM_NNZ_S(A) - Ap[N]))
    newmat = SUNTRUE;
  
  /* perform operation based on existing/necessary structure */

  /*   case 1: A already contains sparsity pattern of B */
  if (newvals == 0) {

    /* iterate through columns, adding matrices */
    for (j=0; j<N; j++) {

      /* clear work array */
      for (i=0; i<M; i++)
        x[i] = ZERO;

      /* scan column of B, updating work array */
      for (i = Bp[j]; i < Bp[j+1]; i++)
        x[Bi[i]] = Bx[i];

      /* scan column of A, updating array entries appropriately */
      for (i = Ap[j]; i < Ap[j+1]; i++)
        Ax[i] = c*Ax[i] + x[Ai[i]];

    }

    
  /*   case 2: A has sufficient storage, but does not already contain B's sparsity */
  } else if (!newmat) {


    /* determine storage location where last column (row) should end */
    nz = Ap[N] + newvals;

    /* store pointer past last column (row) from original A, 
       and store updated value in revised A */ 
    cend = Ap[N];
    Ap[N] = nz;
    
    /* iterate through columns (rows) backwards */
    for (j=N-1; j>=0; j--) {


      /* clear out temporary arrays for this column (row) */
      for (i=0; i<M; i++) {
        w[i] = 0;
        x[i] = RCONST(0.0);
      }

      /* iterate down column (row) of A, collecting nonzeros */
      for (p=Ap[j]; p<cend; p++) {
        w[Ai[p]] += 1;         /* indicate that row (column) is filled */
        x[Ai[p]] = c*Ax[p];    /* collect/scale value */
      }

      /* iterate down column of B, collecting nonzeros */
      for (p=Bp[j]; p<Bp[j+1]; p++) {
        w[Bi[p]] += 1;       /* indicate that row is filled */
        x[Bi[p]] += Bx[p];   /* collect value */
      }

      /* fill entries of A with this column's (row's) data */
      for (i=M-1; i>=0; i--) {
        if ( w[i] > 0 ) { 
          Ai[--nz] = i;  
          Ax[nz] = x[i];
        }
      }

      /* store ptr past this col (row) from orig A, update value for new A */
      cend = Ap[j];
      Ap[j] = nz;
      
    }
    
    
  /*   case 3: A must be reallocated with sufficient storage */
  } else {

    
    /* create new matrix for sum */
    C = SUNSparseMatrix(SM_ROWS_S(A), SM_COLUMNS_S(A),
                        Ap[N] + newvals, SM_SPARSETYPE_S(A));

    /* access data from CSR structures (return if failure) */
    Cp = Ci = NULL;
    Cx = NULL;
    if (SM_INDEXPTRS_S(C))  Cp = SM_INDEXPTRS_S(C);
    else  return(-1);
    if (SM_INDEXVALS_S(C))  Ci = SM_INDEXVALS_S(C);
    else  return(-1);
    if (SM_DATA_S(C))       Cx = SM_DATA_S(C);
    else  return(-1);

    /* initialize total nonzero count */
    nz = 0;

    /* iterate through columns (rows) */
    for (j=0; j<N; j++) {

      /* set current column (row) pointer to current # nonzeros */
      Cp[j] = nz;

      /* clear out temporary arrays for this column (row) */
      for (i=0; i<M; i++) {
        w[i] = 0;
        x[i] = RCONST(0.0);
      }

      /* iterate down column of A, collecting nonzeros */
      for (p=Ap[j]; p<Ap[j+1]; p++) {
        w[Ai[p]] += 1;         /* indicate that row is filled */
        x[Ai[p]] = c*Ax[p];    /* collect/scale value */
      }

      /* iterate down column of B, collecting nonzeros */
      for (p=Bp[j]; p<Bp[j+1]; p++) {
        w[Bi[p]] += 1;       /* indicate that row is filled */
        x[Bi[p]] += Bx[p];   /* collect value */
      }

      /* fill entries of C with this column's data */
      for (i=0; i<M; i++) {
        if ( w[i] > 0 ) { 
          Ci[nz] = i;  
          Cx[nz++] = x[i];
        }
      }
    }

    /* indicate end of data */
    Cp[N] = nz;

    /* update A's structure with C's values; nullify C's pointers */
    SM_NNZ_S(A) = SM_NNZ_S(C);

    free(SM_DATA_S(A));  
    SM_DATA_S(A) = SM_DATA_S(C);
    SM_DATA_S(C) = NULL;

    free(SM_INDEXVALS_S(A));
    SM_INDEXVALS_S(A) = SM_INDEXVALS_S(C);
    SM_INDEXVALS_S(C) = NULL;

    free(SM_INDEXPTRS_S(A));
    SM_INDEXPTRS_S(A) = SM_INDEXPTRS_S(C);
    SM_INDEXPTRS_S(C) = NULL;

    /* clean up */
    SUNMatDestroy_Sparse(C); 

  }

  /* clean up */
  free(w);
  free(x);

  /* return success */
  return(0);

}